

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.h
# Opt level: O0

void __thiscall
DifferenceFormatter::Ser<VectorWriter,unsigned_short>
          (DifferenceFormatter *this,VectorWriter *s,unsigned_short v)

{
  long lVar1;
  unsigned_long uVar2;
  error_code *this_00;
  ushort in_DX;
  ulong *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff90;
  io_errc in_stack_ffffffffffffff94;
  VectorWriter *in_stack_ffffffffffffff98;
  error_code *peVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI <= (ulong)in_DX) {
    uVar2 = std::numeric_limits<unsigned_long>::max();
    if (in_DX < uVar2) {
      WriteCompactSize<VectorWriter>
                (in_stack_ffffffffffffff98,
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      *in_RDI = (ulong)in_DX + 1;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_0034bb94;
    }
  }
  this_00 = (error_code *)__cxa_allocate_exception(0x20);
  peVar3 = this_00;
  std::error_code::error_code<std::io_errc,void>(this_00,in_stack_ffffffffffffff94);
  std::ios_base::failure[abi:cxx11]::failure
            ((char *)this_00,(error_code *)"differential value overflow");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(peVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_0034bb94:
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, I v)
    {
        if (v < m_shift || v >= std::numeric_limits<uint64_t>::max()) throw std::ios_base::failure("differential value overflow");
        WriteCompactSize(s, v - m_shift);
        m_shift = uint64_t(v) + 1;
    }